

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
jessilib::parser_registration<test_parser>::parser_registration
          (parser_registration<test_parser> *this,string *in_format,bool in_force)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 uVar1;
  id iVar2;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  uVar1 = jessilib::impl::parser_manager::instance();
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_28->_M_use_count = 1;
  local_28->_M_weak_count = 1;
  local_28->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00561a40;
  local_30 = local_28 + 1;
  local_28[1]._vptr__Sp_counted_base = (_func_int **)&PTR__parser_00561a90;
  iVar2 = jessilib::impl::parser_manager::register_parser
                    (uVar1,&local_30,in_format,CONCAT71(in_register_00000011,in_force) & 0xffffffff)
  ;
  this->m_id = iVar2;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

parser_registration(std::string in_format, bool in_force = false) {
		m_id = impl::parser_manager::instance().register_parser(std::make_shared<T>(), in_format, in_force);
	}